

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
eigenSolver(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
           vector<double,_std::allocator<double>_> *coeffA)

{
  iterator __position;
  PolynomialSolver<double,_1> *pPVar1;
  ostream *poVar2;
  char *__function;
  long lVar3;
  long lVar4;
  VectorXd coeff;
  PolynomialSolver<double,__1> psolve;
  Matrix<double,__1,_1,_0,__1,_1> local_140;
  PolynomialSolver<double,_1> *local_130;
  long local_128;
  pointer local_118;
  long lStack_110;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_108;
  
  if ((coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"eigen solver begin",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  local_118 = (coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  lStack_110 = (long)(coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)local_118 >> 3;
  if (lStack_110 < 0) {
    __function = 
    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_140,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_118);
    local_118 = (pointer)0x0;
    lStack_110 = 0;
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver(&local_108);
    Eigen::PolynomialSolver<double,-1>::compute<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PolynomialSolver<double,_1> *)&local_118,&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Complex roots: ",0xf);
    local_130 = (PolynomialSolver<double,_1> *)&local_118;
    poVar2 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Transpose<const_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                                *)&local_130);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    if (0 < lStack_110) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        if (ABS(*(double *)((long)local_118 + lVar4)) < 1e-12) {
          local_130 = *(PolynomialSolver<double,_1> **)((long)local_118 + lVar4 + -8);
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,__position,(double *)&local_130);
          }
          else {
            *__position._M_current = (double)local_130;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < lStack_110);
    }
    pPVar1 = (PolynomialSolver<double,_1> *)
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3;
    if (-1 < lVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Real roots: ",0xc);
      local_130 = pPVar1;
      local_128 = lVar3;
      poVar2 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                  *)&local_130);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"eigen solver end",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      free(local_108.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_108.m_matT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_108.m_realSchur.m_hess.m_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_hess.m_hCoeffs.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_hess.m_matrix.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_workspaceVector.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_matU.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_matT.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      free(local_108.m_eivalues.
           super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_108.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_118);
      free(local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      return __return_storage_ptr__;
    }
    __function = 
    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  __assert_fail("vecSize >= 0",
                "/usr/include/eigen3/unsupported/Eigen/../../Eigen/src/Core/MapBase.h",0xa6,
                __function);
}

Assistant:

std::vector<double> eigenSolver(const std::vector<double>& coeffA)
{
    if (coeffA.empty())
        return {};

    std::cout<<"eigen solver begin"<<std::endl;
    using namespace Eigen;
    VectorXd coeff =  VectorXd::Map(coeffA.data(), coeffA.size());

    Eigen::PolynomialSolver<double, Eigen::Dynamic> psolve(coeff);
    std::cout << "Complex roots: " << psolve.roots().transpose() << std::endl;
    std::vector<double> realRoots;
    psolve.realRoots( realRoots );
    Map<VectorXd> mapRR(realRoots.data(), realRoots.size());
    std::cout << "Real roots: " << mapRR.transpose() << std::endl;
    std::cout<<"eigen solver end"<<std::endl;
    return realRoots;
}